

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_2::InMemoryEnv::NewAppendableFile
          (InMemoryEnv *this,string *fname,WritableFile **result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__mutex;
  long lVar1;
  int iVar2;
  mapped_type *ppFVar3;
  mapped_type this_00;
  WritableFileImpl *this_01;
  undefined8 uVar4;
  undefined8 *in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __mutex = &fname->field_2;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    ppFVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
                            *)((long)&fname[1].field_2 + 8),(key_type *)result);
    this_00 = *ppFVar3;
    if (this_00 == (mapped_type)0x0) {
      this_00 = (mapped_type)operator_new(0x78);
      *(undefined8 *)
       ((long)&(this_00->refs_mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__prev + 4) = 0;
      *(undefined8 *)
       ((long)&(this_00->refs_mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__next + 4) = 0;
      *(undefined8 *)((long)&(this_00->refs_mutex_).mu_.super___mutex_base._M_mutex + 0x10) = 0;
      (this_00->refs_mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      (this_00->refs_mutex_).mu_.super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(this_00->refs_mutex_).mu_.super___mutex_base._M_mutex + 8) = 0;
      (this_00->blocks_mutex_).mu_.super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(this_00->blocks_mutex_).mu_.super___mutex_base._M_mutex + 8) = 0;
      *(undefined8 *)((long)&(this_00->blocks_mutex_).mu_.super___mutex_base._M_mutex + 0x10) = 0;
      (this_00->blocks_mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      (this_00->blocks_mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      (this_00->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00->size_ = 0;
      FileState::Ref(this_00);
    }
    this_01 = (WritableFileImpl *)operator_new(0x10);
    WritableFileImpl::WritableFileImpl(this_01,this_00);
    *in_RCX = this_01;
    (this->super_EnvWrapper).super_Env._vptr_Env = (_func_int **)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return (Status)(char *)this;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    uVar4 = std::__throw_system_error(iVar2);
    operator_delete(fname,0x10);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar4);
    }
  }
  __stack_chk_fail();
}

Assistant:

Status NewAppendableFile(const std::string& fname,
                           WritableFile** result) override {
    MutexLock lock(&mutex_);
    FileState** sptr = &file_map_[fname];
    FileState* file = *sptr;
    if (file == nullptr) {
      file = new FileState();
      file->Ref();
    }
    *result = new WritableFileImpl(file);
    return Status::OK();
  }